

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall sf2cute::SoundFont::ClearSamples(SoundFont *this)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<sf2cute::SFSample> *sample;
  pointer psVar2;
  pointer psVar3;
  
  psVar2 = (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 == psVar1) {
    psVar2 = (this->samples_).
             super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->samples_).
             super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar3 = psVar2;
    if (psVar1 != psVar2) {
      do {
        this_00 = (psVar3->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar3 = psVar3 + 1;
      } while (psVar3 != psVar1);
      (this->samples_).
      super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar2;
    }
    return;
  }
  do {
    ((psVar2->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    parent_file_ = (SoundFont *)0x0;
    psVar2 = psVar2 + 1;
  } while (psVar2 != psVar1);
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  clear(&this->samples_);
  return;
}

Assistant:

void SoundFont::ClearSamples() noexcept {
  for (const auto & sample : samples_) {
    sample->reset_parent_file();
  }
  samples_.clear();
}